

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hardwarex.cpp
# Opt level: O0

int StartScanThreadRPLIDARx(RPLIDAR *pRPLIDAR)

{
  int iVar1;
  int local_1c;
  int id;
  RPLIDAR *pRPLIDAR_local;
  
  local_1c = 0;
  do {
    if ((RPLIDAR *)addrsRPLIDAR[local_1c] == pRPLIDAR) {
      resRPLIDAR[local_1c] = 1;
      bExitScanRPLIDAR[local_1c] = 0;
      InitCriticalSection(RPLIDARCS + local_1c);
      iVar1 = CreateDefaultThread(RPLIDARScanThread,pRPLIDAR,RPLIDARScanThreadId + local_1c);
      return iVar1;
    }
    local_1c = local_1c + 1;
  } while (local_1c < 0x10);
  return 1;
}

Assistant:

HARDWAREX_API int StartScanThreadRPLIDARx(RPLIDAR* pRPLIDAR)
{
	int id = 0;

	while (addrsRPLIDAR[id] != pRPLIDAR)
	{
		id++;
		if (id >= MAX_NB_DEVICES_HARDWAREX) return EXIT_FAILURE;
	}

	resRPLIDAR[id] = EXIT_FAILURE;
	bExitScanRPLIDAR[id] = FALSE;
	InitCriticalSection(&RPLIDARCS[id]);
	return CreateDefaultThread(RPLIDARScanThread, (void*)pRPLIDAR, &RPLIDARScanThreadId[id]);
}